

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void __thiscall CodeGenGenericContext::KillUnreadRegisters(CodeGenGenericContext *this)

{
  uint uVar1;
  x86Instruction *pxVar2;
  uint uVar3;
  long lVar4;
  bool *pbVar5;
  
  pxVar2 = this->x86Base;
  uVar3 = this->optimizationCount;
  lVar4 = -0x44;
  pbVar5 = this->genRegRead;
  do {
    if ((*pbVar5 == false) &&
       (uVar1 = *(uint *)(this->genRegRead + lVar4), pxVar2[uVar1].name != o_none)) {
      pxVar2[uVar1].name = o_none;
      uVar3 = uVar3 + 1;
      this->optimizationCount = uVar3;
    }
    this->genRegUpdate[lVar4 * 2] = 0;
    pbVar5 = pbVar5 + 1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  pxVar2 = this->x86Base;
  lVar4 = -0x40;
  pbVar5 = this->xmmRegRead;
  do {
    if ((*pbVar5 == false) &&
       (uVar1 = *(uint *)(this->xmmRegRead + lVar4), pxVar2[uVar1].name != o_none)) {
      pxVar2[uVar1].name = o_none;
      uVar3 = uVar3 + 1;
      this->optimizationCount = uVar3;
    }
    this->xmmRegUpdate[lVar4 * 2] = 0;
    pbVar5 = pbVar5 + 1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  return;
}

Assistant:

void CodeGenGenericContext::KillUnreadRegisters()
{
	for(unsigned i = 0; i < rRegCount; i++)
		KillRegister(x86Reg(i));

	for(unsigned i = 0; i < rXmmRegCount; i++)
		KillRegister(x86XmmReg(i));
}